

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsystemtraytracker.cpp
# Opt level: O2

xcb_visualid_t __thiscall QXcbSystemTrayTracker::visualId(QXcbSystemTrayTracker *this)

{
  xcb_visualid_t xVar1;
  QXcbScreen *pQVar2;
  
  xVar1 = netSystemTrayVisual(this);
  if (xVar1 == 0) {
    pQVar2 = QXcbConnection::primaryScreen(*(QXcbConnection **)(this + 0x20));
    xVar1 = pQVar2->m_virtualDesktop->m_screen->root_visual;
  }
  return xVar1;
}

Assistant:

xcb_visualid_t QXcbSystemTrayTracker::visualId()
{
    xcb_visualid_t visual = netSystemTrayVisual();
    if (visual == XCB_NONE)
        visual = m_connection->primaryScreen()->screen()->root_visual;
    return visual;
}